

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O3

int nni_id_remove(nni_id_map *m,uint64_t id)

{
  nni_id_entry *pnVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint32_t uVar4;
  nni_id_entry *pnVar5;
  uint32_t uVar6;
  int iVar7;
  size_t sVar8;
  
  sVar3 = id_find(m,id);
  if (sVar3 == 0xffffffffffffffff) {
    iVar7 = 0xc;
  }
  else {
    uVar2 = m->id_cap;
    sVar8 = (size_t)((uint)id & uVar2 - 1);
    uVar4 = m->id_load - 1;
    m->id_load = uVar4;
    pnVar5 = m->id_entries;
    pnVar1 = pnVar5 + sVar8;
    while (sVar8 != sVar3) {
      uVar6 = pnVar1->skips;
      if (uVar6 == 0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c"
                  ,0x107,"entry->skips > 0");
        uVar6 = pnVar1->skips;
        uVar2 = m->id_cap;
        uVar4 = m->id_load;
        pnVar5 = m->id_entries;
      }
      pnVar1->skips = uVar6 - 1;
      sVar8 = (size_t)(uVar2 - 1 & (int)sVar8 * 5 + 1U);
      uVar4 = uVar4 - 1;
      m->id_load = uVar4;
      pnVar1 = pnVar5 + sVar8;
    }
    iVar7 = 0;
    pnVar1->val = (void *)0x0;
    pnVar1->key = 0;
    m->id_count = m->id_count - 1;
    id_resize(m);
  }
  return iVar7;
}

Assistant:

int
nni_id_remove(nni_id_map *m, uint64_t id)
{
	size_t index;
	size_t probe;

	if ((index = id_find(m, id)) == (size_t) -1) {
		return (NNG_ENOENT);
	}

	// Now we have found the index where the object exists.  We are going
	// to restart the search, until the index matches, to decrement the
	// skips counter.
	probe = ID_INDEX(m, id);

	for (;;) {
		nni_id_entry *entry;

		// The load was increased once each hashing operation we used
		// to place the item.  Decrement it accordingly.
		m->id_load--;
		entry = &m->id_entries[probe];
		if (probe == index) {
			entry->val = NULL;
			entry->key = 0; // invalid key
			break;
		}
		NNI_ASSERT(entry->skips > 0);
		entry->skips--;
		probe = ID_NEXT(m, probe);
	}

	m->id_count--;

	// Shrink -- but it's ok if we can't.
	(void) id_resize(m);

	return (0);
}